

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

ssize_t __thiscall
clask::response_writer::write(response_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  allocator local_41;
  string local_40 [32];
  void *local_20;
  size_t n_local;
  char *buf_local;
  response_writer *this_local;
  
  local_20 = __buf;
  n_local = (size_t)CONCAT44(in_register_00000034,__fd);
  buf_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,(char *)CONCAT44(in_register_00000034,__fd),(ulong)__buf,&local_41);
  (**this->_vptr_response_writer)(this,local_40);
  std::__cxx11::string::~string(local_40);
  sVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return sVar1;
}

Assistant:

inline void response_writer::write(char* buf, size_t n) {
  write(std::string(buf, n));
}